

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

void sysbvm_tuple_slotAtPut
               (sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex,sysbvm_tuple_t value
               )

{
  uint uVar1;
  undefined1 uVar2;
  
  if ((tuple & 0xf) == 0 && tuple != 0) {
    uVar1 = *(uint *)(tuple + 8);
    if ((char)uVar1 < '\0') {
      sysbvm_error_accessDummyValue();
      uVar1 = *(uint *)(tuple + 8);
    }
    if ((uVar1 & 0x300) == 0x200) {
      if (*(uint *)(tuple + 0xc) <= slotIndex) goto LAB_001394b2;
      uVar2 = 0;
      if ((value & 0xf) != 0) {
        uVar2 = (char)(value >> 4);
      }
      *(undefined1 *)(tuple + 0x10 + slotIndex) = uVar2;
    }
    else {
      if (*(uint *)(tuple + 0xc) >> 3 <= slotIndex) goto LAB_001394b2;
      *(sysbvm_tuple_t *)(tuple + 0x10 + slotIndex * 8) = value;
    }
    return;
  }
  sysbvm_error_modifyImmediateValue();
  if ((tuple & 0xf) != 0) {
    sysbvm_error_modifyImmutableTuple();
  }
LAB_001394b2:
  sysbvm_error_outOfBoundsSlotAccess();
  return;
}

Assistant:

SYSBVM_API void sysbvm_tuple_slotAtPut(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex, sysbvm_tuple_t value)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();
    if(sysbvm_tuple_isImmediate(tuple)) sysbvm_error_modifyImmutableTuple();

    if(sysbvm_tuple_isBytes(tuple))
    {
        if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
            SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex] = sysbvm_tuple_anySize_decode(value) & 0xFF;
        else
            sysbvm_error_outOfBoundsSlotAccess();
    }
    else
    {
        if(slotIndex < sysbvm_tuple_getSizeInSlots(tuple))
            SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->pointers[slotIndex] = value;
        else
            sysbvm_error_outOfBoundsSlotAccess();
    }
}